

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O0

double __thiscall RandomGen::rand_skewGauss(RandomGen *this,double xi,double omega,double alpha)

{
  bool bVar1;
  RandomGen *pRVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double testProb;
  double testY;
  double testX;
  double maxX;
  double minX;
  bool gotValue;
  double height;
  double mode;
  double m_o;
  double sigz;
  double muz;
  double gamma1;
  double delta;
  double alpha_local;
  double omega_local;
  double xi_local;
  RandomGen *this_local;
  
  dVar3 = sqrt(alpha * alpha + 1.0);
  dVar3 = alpha / dVar3;
  dVar4 = pow(dVar3 * 0.7978845608028654,3.0);
  dVar5 = pow(1.0 - (dVar3 * 2.0 * dVar3) / 3.141592653589793,1.5);
  dVar4 = (dVar4 / dVar5) * 0.42920367320510344;
  dVar3 = dVar3 * 0.7978845608028654;
  dVar5 = sqrt(-dVar3 * dVar3 + 1.0);
  if (0.0 < alpha) {
    dVar6 = exp(-6.283185307179586 / alpha);
    mode = dVar6 * -0.5 + -(dVar4 * 0.5) * dVar5 + dVar3;
  }
  if (alpha < 0.0) {
    dVar6 = exp(6.283185307179586 / alpha);
    mode = dVar6 * 0.5 + -(dVar4 * 0.5) * dVar5 + dVar3;
  }
  dVar4 = omega * mode + xi;
  dVar5 = pow((dVar4 - xi) / omega,2.0);
  dVar5 = exp(dVar5 * -0.5);
  dVar4 = erfc(((alpha * -1.0 * (dVar4 - xi)) / omega) / 1.414213562373095);
  bVar1 = false;
  dVar3 = omega * -6.0 + xi;
  while (!bVar1) {
    pRVar2 = rndm();
    dVar6 = rand_uniform(pRVar2);
    testY = ((omega * 6.0 + xi) - dVar3) * dVar6 + dVar3;
    pRVar2 = rndm();
    dVar6 = rand_uniform(pRVar2);
    dVar7 = pow((testY - xi) / omega,2.0);
    dVar7 = exp(dVar7 * -0.5);
    dVar8 = erfc(((alpha * -1.0 * (testY - xi)) / omega) / 1.414213562373095);
    if ((dVar5 / (omega * 2.5066282746310007)) * dVar4 * dVar6 <=
        (dVar7 / (omega * 2.5066282746310007)) * dVar8) {
      bVar1 = true;
    }
  }
  return testY;
}

Assistant:

double RandomGen::rand_skewGauss(double xi, double omega, double alpha) {
  double delta = alpha / sqrt(1 + alpha * alpha);
  double gamma1 = four_minus_PI_div_2 *
                  (pow(delta * sqrt2_div_PI, 3.) /
                   pow(1 - 2. * delta * delta / M_PI, 1.5));  // skewness
  double muz = delta * sqrt2_div_PI;
  double sigz = sqrt(1. - muz * muz);
  double m_o;
  if (alpha > 0.) {
    m_o = muz - 0.5 * gamma1 * sigz - 0.5 * exp(-two_PI / alpha);
  }
  if (alpha < 0.) {
    m_o = muz - 0.5 * gamma1 * sigz + 0.5 * exp(two_PI / alpha);
  }
  double mode = xi + omega * m_o;
  // the height should be the value of the PDF at the mode
  double height = exp(-0.5 * (pow((mode - xi) / omega, 2.))) /
                  (sqrt2_PI * omega) *
                  erfc(-1. * alpha * (mode - xi) / omega / sqrt2);
  bool gotValue = false;
  double minX = xi - 6. * omega;
  double maxX =
      xi + 6. * omega;  // +/- 6sigma should be essentially +/- infinity
                        //  can increase these for even better accuracy, at the
                        //  cost of speed
  double testX, testY, testProb;
  while (gotValue == false) {
    testX = minX + (maxX - minX) * RandomGen::rndm()->rand_uniform();
    testY = height *
            RandomGen::rndm()->rand_uniform();  // between 0 and peak height
    // calculate the value of the skewGauss PDF at the test x-value
    testProb = exp(-0.5 * (pow((testX - xi) / omega, 2.))) /
               (sqrt2_PI * omega) *
               erfc(-1. * alpha * (testX - xi) / omega / sqrt2);
    if (testProb >= testY) {
      gotValue = true;
    }
  }
  return testX;
}